

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_textedit_layout_row
               (nk_text_edit_row *r,nk_text_edit *edit,int line_start_id,float row_height,
               nk_user_font *font)

{
  int pos;
  char *pcVar1;
  char **in_RCX;
  int in_EDX;
  char *in_RSI;
  nk_user_font *in_RDI;
  float in_XMM0_Da;
  nk_vec2 nVar2;
  nk_vec2 size;
  char *text;
  char *end;
  int len;
  char *remaining;
  nk_rune unicode;
  int glyphs;
  int l;
  float local_58;
  float fStack_54;
  int *in_stack_ffffffffffffffb0;
  nk_str *in_stack_ffffffffffffffc8;
  int *in_stack_ffffffffffffffd0;
  undefined4 uVar3;
  undefined4 in_stack_ffffffffffffffdc;
  
  uVar3 = 0;
  pos = nk_str_len_char((nk_str *)(in_RSI + 0x18));
  pcVar1 = nk_str_get_const((nk_str *)(in_RSI + 0x18));
  nk_str_at_const(in_stack_ffffffffffffffc8,pos,(nk_rune *)(pcVar1 + pos),in_stack_ffffffffffffffb0)
  ;
  nVar2 = nk_text_calculate_text_bounds
                    (in_RDI,in_RSI,in_EDX,in_XMM0_Da,in_RCX,
                     (nk_vec2 *)CONCAT44(in_stack_ffffffffffffffdc,uVar3),in_stack_ffffffffffffffd0,
                     (int)size.x);
  (in_RDI->userdata).id = 0;
  local_58 = nVar2.x;
  *(float *)((long)&in_RDI->userdata + 4) = local_58;
  fStack_54 = nVar2.y;
  in_RDI->height = fStack_54;
  *(undefined4 *)&in_RDI->field_0xc = 0;
  *(float *)&in_RDI->width = fStack_54;
  *(undefined4 *)((long)&in_RDI->width + 4) = uVar3;
  return;
}

Assistant:

NK_INTERN void
nk_textedit_layout_row(struct nk_text_edit_row *r, struct nk_text_edit *edit,
int line_start_id, float row_height, const struct nk_user_font *font)
{
int l;
int glyphs = 0;
nk_rune unicode;
const char *remaining;
int len = nk_str_len_char(&edit->string);
const char *end = nk_str_get_const(&edit->string) + len;
const char *text = nk_str_at_const(&edit->string, line_start_id, &unicode, &l);
const struct nk_vec2 size = nk_text_calculate_text_bounds(font,
text, (int)(end - text), row_height, &remaining, 0, &glyphs, NK_STOP_ON_NEW_LINE);

r->x0 = 0.0f;
r->x1 = size.x;
r->baseline_y_delta = size.y;
r->ymin = 0.0f;
r->ymax = size.y;
r->num_chars = glyphs;
}